

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void store_dataset(path *db_base,string *fname,
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *index_names,string *fname_list,
                  optional<std::basic_string_view<char,_std::char_traits<char>_>_> fname_cache,
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *taints)

{
  value_t vVar1;
  json_value jVar2;
  long lVar3;
  reference pvVar4;
  ostream *poVar5;
  pointer *ppbVar6;
  json j_indices;
  json dataset;
  path __result;
  ofstream o;
  undefined1 auStack_318 [8];
  value_t local_310;
  json_value local_308;
  value_t local_300;
  json_value local_2f8;
  value_t local_2f0;
  json_value local_2e8;
  undefined1 local_2e0 [8];
  json_value local_2d8;
  undefined1 local_2d0 [8];
  json_value local_2c8;
  undefined1 local_2c0 [8];
  json_value local_2b8;
  path local_2b0;
  path local_270;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pointer local_228;
  _Rb_tree_node_base local_220 [7];
  ios_base local_138 [264];
  
  local_2d0[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x0;
  local_2c8.object = (object_t *)0x0;
  local_2d8.object = (object_t *)0x0;
  local_2e0[0] = array;
  local_230._M_node = (index_names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._M_pathname._M_dataplus._M_p =
       (pointer)&(index_names->_M_t)._M_impl.super__Rb_tree_header;
  local_2d8.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                 (&local_230,
                  (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2b0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_2c0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_2e0);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_2d0,"indices");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_2c0[0];
  jVar2 = pvVar4->m_value;
  pvVar4->m_value = local_2b8;
  local_2c0[0] = vVar1;
  local_2b8 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_2c0 + 8),vVar1);
  local_2e8.object = (object_t *)0x0;
  local_2f0 = string;
  local_2e8.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,std::__cxx11::string_const&>(fname_list);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_2d0,"files");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_2f0;
  jVar2 = pvVar4->m_value;
  (pvVar4->m_value).object = (object_t *)local_2e8;
  local_2f0 = vVar1;
  local_2e8 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_2e8.boolean,vVar1);
  local_2f8.object = (object_t *)0x0;
  local_300 = array;
  local_230._M_node = (taints->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._M_pathname._M_dataplus._M_p = (pointer)&(taints->_M_t)._M_impl.super__Rb_tree_header;
  local_2f8.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                 (&local_230,
                  (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2b0);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_2d0,"taints");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_300;
  jVar2 = pvVar4->m_value;
  (pvVar4->m_value).object = (object_t *)local_2f8;
  local_300 = vVar1;
  local_2f8 = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_2f8.boolean,vVar1);
  if (fname_cache.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    local_230._M_node = local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               fname_cache.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value._M_str,
               fname_cache.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value._M_str +
               fname_cache.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value._M_len);
    local_308.object = (object_t *)0x0;
    local_310 = string;
    local_308.object = (object_t *)operator_new(0x20);
    ppbVar6 = &((local_308.array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
    ((local_308.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar6;
    if (local_230._M_node == local_220) {
      *ppbVar6 = (pointer)CONCAT71(local_220[0]._1_7_,(undefined1)local_220[0]._M_color);
      local_308.array[1].
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_220[0]._M_parent;
    }
    else {
      ((local_308.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_230._M_node;
      ((local_308.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(local_220[0]._1_7_,(undefined1)local_220[0]._M_color);
    }
    ((local_308.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = local_228;
    local_228 = (pointer)0x0;
    local_220[0]._M_color._0_1_ = _S_red;
    local_230._M_node = local_220;
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_2d0,"filename_cache");
    vVar1 = pvVar4->m_type;
    pvVar4->m_type = local_310;
    jVar2 = pvVar4->m_value;
    (pvVar4->m_value).array = (array_t *)local_308;
    local_310 = vVar1;
    local_308 = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_308.boolean,vVar1);
    if (local_230._M_node != local_220) {
      operator_delete(local_230._M_node,
                      CONCAT71(local_220[0]._1_7_,(undefined1)local_220[0]._M_color) + 1);
    }
  }
  std::ofstream::ofstream(&local_230);
  lVar3 = ((json_value *)&local_230._M_node[-1]._M_parent)->number_integer;
  *(undefined4 *)(&local_220[0].field_0x4 + lVar3 + 8) = 1;
  std::ios::clear((int)(auStack_318 + lVar3) + 0xe8);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_270,fname);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_2b0,db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_2b0,&local_270._M_pathname);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_2b0._M_pathname._M_dataplus._M_p);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_270);
  *(undefined8 *)
   (&(((json_value *)&local_230._M_node[-1]._M_parent)->object->_M_t)._M_impl.field_0x0 +
   (long)&local_220[0]._M_color) = 4;
  poVar5 = nlohmann::operator<<
                     ((ostream *)&local_230,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_2d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ostream::flush();
  local_230._M_node = _VTT;
  *(undefined8 *)((long)&(_VTT[-1]._M_parent)->_M_color + (long)&local_230._M_node) = _seekpos;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_2e0 + 8),local_2e0[0]);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_2d0 + 8),(value_t)local_2d0[0]);
  return;
}

Assistant:

void store_dataset(const fs::path &db_base, const std::string &fname,
                   const std::set<std::string> &index_names,
                   const std::string &fname_list,
                   std::optional<std::string_view> fname_cache,
                   const std::set<std::string> &taints) {
    json dataset;
    json j_indices(index_names);

    dataset["indices"] = j_indices;
    dataset["files"] = fname_list;
    dataset["taints"] = taints;

    if (fname_cache) {
        dataset["filename_cache"] = std::string(*fname_cache);
    }

    std::ofstream o;
    o.exceptions(std::ofstream::badbit);
    o.open(db_base / fname, std::ofstream::binary);

    o << std::setw(4) << dataset << std::endl;
    o.flush();
}